

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O3

bool_t rngTestFIPS3(octet *buf)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  word s [2] [7];
  long alStack_78 [4];
  long local_58;
  long local_50;
  long local_48;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  memSet(alStack_78,'\0',0x70);
  bVar2 = (bool)(*buf & 1);
  uVar1 = 1;
  uVar3 = 1;
  do {
    if (((buf[uVar1 >> 3] >> ((uint)uVar1 & 7) & 1) != 0) == bVar2) {
      uVar3 = uVar3 + 1;
    }
    else {
      if (5 < uVar3) {
        uVar3 = 6;
      }
      alStack_78[(ulong)bVar2 * 7 + (uVar3 & 0xffffffff)] =
           alStack_78[(ulong)bVar2 * 7 + (uVar3 & 0xffffffff)] + 1;
      bVar2 = bVar2 == false;
      uVar3 = 1;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 20000);
  uVar1 = 6;
  if (uVar3 < 6) {
    uVar1 = uVar3;
  }
  alStack_78[(ulong)bVar2 * 7 + (uVar1 & 0xffffffff)] =
       alStack_78[(ulong)bVar2 * 7 + (uVar1 & 0xffffffff)] + 1;
  return (bool_t)(local_10 - 0x67U < 0x6b &&
                 ((local_48 - 0x67U < 0x6b &&
                  (local_18 - 0x67U < 0x6b && (local_50 - 0x67U < 0x6b && local_20 - 0xf0U < 0x91)))
                 && ((local_58 - 0xf0U < 0x91 &&
                     (local_28 - 0x20fU < 0xc5 && alStack_78[3] - 0x20fU < 0xc5)) &&
                    ((local_30 - 0x45aU < 0x111 && alStack_78[2] - 0x45aU < 0x111) &&
                    (local_38 - 0x90bU < 0x173 && alStack_78[1] - 0x90bU < 0x173)))));
}

Assistant:

bool_t rngTestFIPS3(const octet buf[2500])
{
	word s[2][7];
	octet b;
	size_t l;
	size_t i;
	ASSERT(memIsValid(buf, 2500));
	memSetZero(s, sizeof(s));
	b = buf[0] & 1;
	l = 1;
	for (i = 1; i < 20000; ++i)
		if ((buf[i / 8] >> i % 8 & 1) == b)
			++l;
		else
			++s[b][MIN2(l, 6)], b = !b, l = 1;
	++s[b][MIN2(l, 6)];
	return 2315 <= s[0][1] && s[0][1] <= 2685 &&
		2315 <= s[1][1] && s[1][1] <= 2685 &&
		1114 <= s[0][2] && s[0][2] <= 1386 &&
		1114 <= s[1][2] && s[1][2] <= 1386 &&
		527 <= s[0][3] && s[0][3] <= 723 &&
		527 <= s[1][3] && s[1][3] <= 723 &&
		240 <= s[0][4] && s[0][4] <= 384 &&
		240 <= s[1][4] && s[1][4] <= 384 &&
		103 <= s[0][5] && s[0][5] <= 209 &&
		103 <= s[1][5] && s[1][5] <= 209 &&
		103 <= s[0][6] && s[0][6] <= 209 &&
		103 <= s[1][6] && s[1][6] <= 209;
}